

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

edata_t * duckdb_je_extent_alloc_wrapper
                    (tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,void *new_addr,size_t size,
                    size_t alignment,_Bool zero,_Bool *commit,_Bool growing_retained)

{
  atomic_zu_t *paVar1;
  size_t sVar2;
  uint arena_ind;
  _Bool _Var3;
  edata_t *edata;
  void *addr;
  size_t size_00;
  extent_pai_t in_stack_ffffffffffffffb8;
  extent_head_state_t in_stack_ffffffffffffffc0;
  _Bool zero_local;
  size_t local_38;
  
  zero_local = zero;
  local_38 = size;
  edata = duckdb_je_edata_cache_get(tsdn,pac->edata_cache);
  size_00 = local_38;
  if (edata != (edata_t *)0x0) {
    addr = ehooks_alloc(tsdn,ehooks,new_addr,local_38,alignment + 0xfff & 0xfffffffffffff000,
                        &zero_local,commit);
    if (addr != (void *)0x0) {
      arena_ind = (pac->ecache_dirty).ind;
      LOCK();
      paVar1 = &pac->duckdb_je_extent_sn_next;
      sVar2 = paVar1->repr;
      paVar1->repr = paVar1->repr + 1;
      UNLOCK();
      edata_init(edata,arena_ind,addr,size_00,SUB81(sVar2,0),0,(ulong)zero_local,(uint)*commit,
                 duckdb_je_opt_retain,true,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
      _Var3 = extent_register_impl(tsdn,pac,edata,SUB81(size_00,0));
      if (!_Var3) {
        return edata;
      }
    }
    duckdb_je_edata_cache_put(tsdn,pac->edata_cache,edata);
  }
  return (edata_t *)0x0;
}

Assistant:

edata_t *
extent_alloc_wrapper(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    void *new_addr, size_t size, size_t alignment, bool zero, bool *commit,
    bool growing_retained) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, growing_retained ? 1 : 0);

	edata_t *edata = edata_cache_get(tsdn, pac->edata_cache);
	if (edata == NULL) {
		return NULL;
	}
	size_t palignment = ALIGNMENT_CEILING(alignment, PAGE);
	void *addr = ehooks_alloc(tsdn, ehooks, new_addr, size, palignment,
	    &zero, commit);
	if (addr == NULL) {
		edata_cache_put(tsdn, pac->edata_cache, edata);
		return NULL;
	}
	edata_init(edata, ecache_ind_get(&pac->ecache_dirty), addr,
	    size, /* slab */ false, SC_NSIZES, extent_sn_next(pac),
	    extent_state_active, zero, *commit, EXTENT_PAI_PAC,
	    opt_retain ? EXTENT_IS_HEAD : EXTENT_NOT_HEAD);
	/*
	 * Retained memory is not counted towards gdump.  Only if an extent is
	 * allocated as a separate mapping, i.e. growing_retained is false, then
	 * gdump should be updated.
	 */
	bool gdump_add = !growing_retained;
	if (extent_register_impl(tsdn, pac, edata, gdump_add)) {
		edata_cache_put(tsdn, pac->edata_cache, edata);
		return NULL;
	}

	return edata;
}